

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hxx
# Opt level: O0

size_t andres::graph::
       labelComponents<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>,lineage::validate(lineage::ProblemGraph_const&,lineage::Solution_const&)::SubgraphWithoutCut,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
                 (Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *graph,
                 SubgraphWithoutCut *mask,
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 labeling)

{
  ulong uVar1;
  SubgraphWithoutCut *this;
  bool bVar2;
  size_t sVar3;
  reference pvVar4;
  pointer pAVar5;
  Value VVar6;
  reference puVar7;
  SubgraphWithoutCut *in_RSI;
  reference rVar8;
  reference rVar9;
  AdjacencyIterator it;
  size_t w;
  size_t v;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> queue;
  vector<bool,_std::allocator<bool>_> visited;
  size_t label;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffe28;
  unsigned_long uVar10;
  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
  *in_stack_fffffffffffffe30;
  allocator_type *in_stack_fffffffffffffe38;
  bool *in_stack_fffffffffffffe40;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  *in_stack_fffffffffffffe48;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe50;
  byte local_191;
  reference local_118;
  Value local_108;
  reference local_100;
  Adjacency<unsigned_long> *local_f0;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_e8;
  value_type local_e0;
  reference local_d8;
  reference local_c8;
  ulong local_b8;
  undefined1 local_49;
  unsigned_long local_20;
  SubgraphWithoutCut *local_18;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_8;
  
  local_20 = 0;
  local_18 = in_RSI;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
            ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1a3538);
  local_49 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x1a355d);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48,
             in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  std::allocator<bool>::~allocator((allocator<bool> *)0x1a3591);
  std::queue<unsigned_long,std::deque<unsigned_long,std::allocator<unsigned_long>>>::
  queue<std::deque<unsigned_long,std::allocator<unsigned_long>>,void>(in_stack_fffffffffffffe30);
  rVar9._M_mask = (_Bit_type)in_stack_fffffffffffffe30;
  rVar9._M_p = (_Bit_type *)in_stack_fffffffffffffe38;
  local_b8 = 0;
  while( true ) {
    uVar1 = local_b8;
    sVar3 = Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::numberOfVertices
                      ((Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x1a35c9);
    if (sVar3 <= uVar1) break;
    bVar2 = lineage::validate::SubgraphWithoutCut::vertex(local_18,local_b8);
    if (bVar2) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
      local_c8 = rVar8;
      bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_c8);
      uVar10 = local_20;
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        puVar7 = __gnu_cxx::
                 __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                 ::operator[](&local_8,local_b8);
        *puVar7 = uVar10;
        std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::push
                  ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)rVar9._M_mask,(value_type *)in_stack_fffffffffffffe28);
        rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
        local_d8 = rVar8;
        std::_Bit_reference::operator=(&local_d8,true);
        while( true ) {
          bVar2 = std::
                  queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::
                  empty((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                         *)0x1a3711);
          if (((bVar2 ^ 0xffU) & 1) == 0) break;
          pvVar4 = std::
                   queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                   ::front((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)0x1a3733);
          local_e0 = *pvVar4;
          std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::pop
                    ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)0x1a3757);
          local_e8._M_current =
               (Adjacency<unsigned_long> *)
               Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesFromVertexBegin
                         (in_stack_fffffffffffffe28,0x1a376e);
          while( true ) {
            local_f0 = (Adjacency<unsigned_long> *)
                       Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                       adjacenciesFromVertexEnd(in_stack_fffffffffffffe28,0x1a3797);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)rVar9._M_mask,
                               (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                                *)in_stack_fffffffffffffe28);
            if (!bVar2) break;
            pAVar5 = __gnu_cxx::
                     __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                     ::operator->(&local_e8);
            Adjacency<unsigned_long>::edge(pAVar5);
            bVar2 = lineage::validate::SubgraphWithoutCut::edge
                              ((SubgraphWithoutCut *)rVar9._M_mask,(size_t)in_stack_fffffffffffffe28
                              );
            this = local_18;
            local_191 = 0;
            if (bVar2) {
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(&local_e8);
              VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
              bVar2 = lineage::validate::SubgraphWithoutCut::vertex(this,VVar6);
              local_191 = 0;
              if (bVar2) {
                pAVar5 = __gnu_cxx::
                         __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                         ::operator->(&local_e8);
                Adjacency<unsigned_long>::vertex(pAVar5);
                rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                  (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
                in_stack_fffffffffffffe50 = (vector<bool,_std::allocator<bool>_> *)rVar8._M_mask;
                local_100 = rVar8;
                bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_100);
                local_191 = bVar2 ^ 0xff;
              }
            }
            if ((local_191 & 1) != 0) {
              in_stack_fffffffffffffe48 = &local_e8;
              uVar10 = local_20;
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(in_stack_fffffffffffffe48);
              VVar6 = Adjacency<unsigned_long>::vertex(pAVar5);
              puVar7 = __gnu_cxx::
                       __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                       ::operator[](&local_8,VVar6);
              *puVar7 = uVar10;
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(in_stack_fffffffffffffe48);
              local_108 = Adjacency<unsigned_long>::vertex(pAVar5);
              std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
              ::push((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>
                      *)rVar9._M_mask,(value_type *)in_stack_fffffffffffffe28);
              pAVar5 = __gnu_cxx::
                       __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                       ::operator->(&local_e8);
              Adjacency<unsigned_long>::vertex(pAVar5);
              rVar9 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                (in_stack_fffffffffffffe50,(size_type)in_stack_fffffffffffffe48);
              local_118 = rVar9;
              std::_Bit_reference::operator=(&local_118,true);
            }
            __gnu_cxx::
            __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
            ::operator++(&local_e8);
          }
        }
        local_20 = local_20 + 1;
      }
    }
    else {
      puVar7 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator[](&local_8,local_b8);
      *puVar7 = 0;
    }
    local_b8 = local_b8 + 1;
  }
  uVar10 = local_20;
  std::queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_>::~queue
            ((queue<unsigned_long,_std::deque<unsigned_long,_std::allocator<unsigned_long>_>_> *)
             0x1a3a76);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x1a3a83)
  ;
  return uVar10;
}

Assistant:

std::size_t
labelComponents(
    const GRAPH& graph,
    const SUBGRAPH_MASK& mask,
    ITERATOR labeling
) {
    std::size_t label = 0;
    std::vector<bool> visited(graph.numberOfVertices(), false);
    std::queue<std::size_t> queue;
    for(std::size_t v = 0; v < graph.numberOfVertices(); ++v) {
        if(mask.vertex(v)) {
            if(!visited[v]) {
                labeling[v] = label; // label
                queue.push(v);
                visited[v] = true;
                while(!queue.empty()) {
                    std::size_t w = queue.front();
                    queue.pop();
                    for(typename GRAPH::AdjacencyIterator it = graph.adjacenciesFromVertexBegin(w);
                    it != graph.adjacenciesFromVertexEnd(w); ++it) {
                        if(mask.edge(it->edge()) 
                        && mask.vertex(it->vertex()) 
                        && !visited[it->vertex()]) {
                            labeling[it->vertex()] = label; // label
                            queue.push(it->vertex());
                            visited[it->vertex()] = true;
                        }
                    }
                }
                label++;
            }
        }
        else {
            labeling[v] = 0;
        }
    }
    return label;
}